

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O2

void init_opengl(void)

{
  (*glad_glShadeModel)(0x1d01);
  (*glad_glEnable)(0xb71);
  (*glad_glEnableClientState)(0x8074);
  (*glad_glEnableClientState)(0x8076);
  (*glad_glVertexPointer)(3,0x1406,0x18,vertex);
  (*glad_glColorPointer)(3,0x1406,0x18,(void *)0x15624c);
  (*glad_glPointSize)(2.0);
  (*glad_glClearColor)(0.0,0.0,0.0,0.0);
  return;
}

Assistant:

void init_opengl(void)
{
    // Use Gouraud (smooth) shading
    glShadeModel(GL_SMOOTH);

    // Switch on the z-buffer
    glEnable(GL_DEPTH_TEST);

    glEnableClientState(GL_VERTEX_ARRAY);
    glEnableClientState(GL_COLOR_ARRAY);
    glVertexPointer(3, GL_FLOAT, sizeof(struct Vertex), vertex);
    glColorPointer(3, GL_FLOAT, sizeof(struct Vertex), &vertex[0].r); // Pointer to the first color

    glPointSize(2.0);

    // Background color is black
    glClearColor(0, 0, 0, 0);
}